

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

void CMAC_CTX_cleanup(CMAC_CTX *ctx)

{
  EVP_CIPHER_CTX_reset((EVP_CIPHER_CTX *)ctx);
  OPENSSL_cleanse(ctx + 0x48,0x20);
  OPENSSL_cleanse(ctx + 8,0x20);
  OPENSSL_cleanse(ctx + 0x28,0x20);
  OPENSSL_cleanse(ctx + 0x68,0x20);
  *(undefined4 *)(ctx + 0x88) = 0xffffffff;
  return;
}

Assistant:

void CMAC_CTX_cleanup(CMAC_CTX *ctx)
{
    EVP_CIPHER_CTX_reset(ctx->cctx);
    OPENSSL_cleanse(ctx->tbl, EVP_MAX_BLOCK_LENGTH);
    OPENSSL_cleanse(ctx->k1, EVP_MAX_BLOCK_LENGTH);
    OPENSSL_cleanse(ctx->k2, EVP_MAX_BLOCK_LENGTH);
    OPENSSL_cleanse(ctx->last_block, EVP_MAX_BLOCK_LENGTH);
    ctx->nlast_block = -1;
}